

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles2::Functional::(anonymous_namespace)::ConstantShaderGenerator::next_abi_cxx11_
          (string *__return_storage_ptr__,void *this,ShaderType shaderType)

{
  char *__s;
  float value;
  string outputName;
  string valueString;
  float local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  local_b4 = deRandom_getFloat((deRandom *)((long)this + 8));
  local_b4 = local_b4 + 0.0;
  de::toString<float>(&local_30,&local_b4);
  __s = "gl_FragColor";
  if (shaderType == SHADERTYPE_VERTEX) {
    __s = "gl_Position";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,__s,(allocator<char> *)&local_b0);
  std::operator+(&local_90,"#version 100\nvoid main (void) { ",&local_50);
  std::operator+(&local_70,&local_90," = vec4(");
  std::operator+(&local_b0,&local_70,&local_30);
  std::operator+(__return_storage_ptr__,&local_b0,"); }\n");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ConstantShaderGenerator::next (const glu::ShaderType shaderType)
{
	DE_ASSERT(shaderType == glu::SHADERTYPE_VERTEX || shaderType == glu::SHADERTYPE_FRAGMENT);

	const float			value		= m_rnd.getFloat(0.0f, 1.0f);
	const std::string	valueString	= de::toString(value);
	const std::string	outputName	= (shaderType == glu::SHADERTYPE_VERTEX) ? "gl_Position" : "gl_FragColor";

	std::string source =
		"#version 100\n"
		"void main (void) { " + outputName + " = vec4(" + valueString + "); }\n";

	return source;
}